

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaValidatorPushElem(xmlSchemaValidCtxtPtr vctxt)

{
  int iVar1;
  int iVar2;
  xmlSchemaNodeInfoPtr __s;
  xmlSchemaNodeInfoPtr *ppxVar3;
  char *message;
  uint uVar4;
  uint uVar5;
  xmlChar *in_R8;
  ulong uVar6;
  
  iVar2 = vctxt->depth;
  iVar1 = vctxt->sizeElemInfos;
  uVar6 = (ulong)iVar1;
  if (iVar1 < iVar2) {
    message = "inconsistent depth encountered";
LAB_001a6070:
    __s = (xmlSchemaNodeInfoPtr)0x0;
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaGetFreshElemInfo",message,(xmlChar *)0x0,
               in_R8);
    goto LAB_001a6169;
  }
  if (iVar2 < iVar1) {
    __s = vctxt->elemInfos[iVar2];
LAB_001a6056:
    if (__s == (xmlSchemaNodeInfoPtr)0x0) {
      __s = (xmlSchemaNodeInfoPtr)(*xmlMalloc)(0x90);
      if (__s == (xmlSchemaNodeInfoPtr)0x0) goto LAB_001a615e;
      vctxt->elemInfos[vctxt->depth] = __s;
    }
    else if (__s->localName != (xmlChar *)0x0) {
      message = "elem info has not been cleared";
      goto LAB_001a6070;
    }
    memset(__s,0,0x90);
    __s->nodeType = 1;
    __s->depth = vctxt->depth;
  }
  else {
    if (iVar1 < 1) {
      uVar5 = 10;
    }
    else {
      uVar5 = 0xffffffff;
      if (iVar1 < 1000000000) {
        uVar4 = iVar1 + 1U >> 1;
        uVar5 = uVar4 + iVar1;
        if ((int)(1000000000 - uVar4) < iVar1) {
          uVar5 = 1000000000;
        }
      }
    }
    if (-1 < (int)uVar5) {
      ppxVar3 = (xmlSchemaNodeInfoPtr *)(*xmlRealloc)(vctxt->elemInfos,(ulong)uVar5 * 8);
      if (ppxVar3 != (xmlSchemaNodeInfoPtr *)0x0) {
        vctxt->elemInfos = ppxVar3;
        vctxt->sizeElemInfos = uVar5;
        __s = (xmlSchemaNodeInfoPtr)0x0;
        if (iVar1 < (int)uVar5) {
          do {
            vctxt->elemInfos[uVar6] = (xmlSchemaNodeInfoPtr)0x0;
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
        goto LAB_001a6056;
      }
    }
LAB_001a615e:
    xmlSchemaVErrMemory(vctxt);
    __s = (xmlSchemaNodeInfoPtr)0x0;
  }
LAB_001a6169:
  vctxt->inode = __s;
  if (__s == (xmlSchemaNodeInfoPtr)0x0) {
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidatorPushElem",
               "calling xmlSchemaGetFreshElemInfo()",(xmlChar *)0x0,in_R8);
    iVar2 = -1;
  }
  else {
    vctxt->nbAttrInfos = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaValidatorPushElem(xmlSchemaValidCtxtPtr vctxt)
{
    vctxt->inode = xmlSchemaGetFreshElemInfo(vctxt);
    if (vctxt->inode == NULL) {
	VERROR_INT("xmlSchemaValidatorPushElem",
	    "calling xmlSchemaGetFreshElemInfo()");
	return (-1);
    }
    vctxt->nbAttrInfos = 0;
    return (0);
}